

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_rp__skyline_find_min_y(nk_rp_context *c,nk_rp_node *first,int x0,int width,int *pwaste)

{
  int iVar1;
  int local_44;
  int local_40;
  int under_width;
  int waste_area;
  int visited_width;
  int min_y;
  int x1;
  nk_rp_node *node;
  int *pwaste_local;
  int width_local;
  int x0_local;
  nk_rp_node *first_local;
  nk_rp_context *c_local;
  
  if (x0 < (int)(uint)first->x) {
    __assert_fail("first->x <= x0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x294e,
                  "int nk_rp__skyline_find_min_y(struct nk_rp_context *, struct nk_rp_node *, int, int, int *)"
                 );
  }
  if ((int)(uint)first->next->x <= x0) {
    __assert_fail("node->next->x > x0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x2951,
                  "int nk_rp__skyline_find_min_y(struct nk_rp_context *, struct nk_rp_node *, int, int, int *)"
                 );
  }
  if (x0 < (int)(uint)first->x) {
    __assert_fail("node->x <= x0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x2953,
                  "int nk_rp__skyline_find_min_y(struct nk_rp_context *, struct nk_rp_node *, int, int, int *)"
                 );
  }
  waste_area = 0;
  local_40 = 0;
  under_width = 0;
  for (_min_y = first; (int)(uint)_min_y->x < x0 + width; _min_y = _min_y->next) {
    if ((uint)waste_area < (uint)_min_y->y) {
      iVar1 = under_width * ((uint)_min_y->y - waste_area);
      waste_area = (int)_min_y->y;
      if ((int)(uint)_min_y->x < x0) {
        local_44 = (uint)_min_y->next->x - x0;
      }
      else {
        local_44 = (uint)_min_y->next->x - (uint)_min_y->x;
      }
    }
    else {
      local_44 = (uint)_min_y->next->x - (uint)_min_y->x;
      if (width < local_44 + under_width) {
        local_44 = width - under_width;
      }
      iVar1 = local_44 * (waste_area - (uint)_min_y->y);
    }
    under_width = local_44 + under_width;
    local_40 = iVar1 + local_40;
  }
  *pwaste = local_40;
  return waste_area;
}

Assistant:

NK_INTERN int
nk_rp__skyline_find_min_y(struct nk_rp_context *c, struct nk_rp_node *first,
    int x0, int width, int *pwaste)
{
    struct nk_rp_node *node = first;
    int x1 = x0 + width;
    int min_y, visited_width, waste_area;
    NK_ASSERT(first->x <= x0);
    NK_UNUSED(c);

    NK_ASSERT(node->next->x > x0);
    /* we ended up handling this in the caller for efficiency */
    NK_ASSERT(node->x <= x0);

    min_y = 0;
    waste_area = 0;
    visited_width = 0;
    while (node->x < x1)
    {
        if (node->y > min_y) {
            /* raise min_y higher. */
            /* we've accounted for all waste up to min_y, */
            /* but we'll now add more waste for everything we've visited */
            waste_area += visited_width * (node->y - min_y);
            min_y = node->y;
            /* the first time through, visited_width might be reduced */
            if (node->x < x0)
            visited_width += node->next->x - x0;
            else
            visited_width += node->next->x - node->x;
        } else {
            /* add waste area */
            int under_width = node->next->x - node->x;
            if (under_width + visited_width > width)
            under_width = width - visited_width;
            waste_area += under_width * (min_y - node->y);
            visited_width += under_width;
        }
        node = node->next;
    }
    *pwaste = waste_area;
    return min_y;
}